

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferObjectQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::BufferUsageCase::testBuffer(BufferUsageCase *this)

{
  uint usage;
  BufferParamVerifier *pBVar1;
  long lVar2;
  
  pBVar1 = (this->super_BufferCase).m_verifier;
  (*pBVar1->_vptr_BufferParamVerifier[2])
            (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                    super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8765,
             0x88e4);
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    usage = *(uint *)((long)&DAT_005c72c4 + lVar2);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_ApiCase.super_CallLogWrapper,
               (this->super_BufferCase).m_bufferTarget,0x10,(void *)0x0,usage);
    ApiCase::expectError((ApiCase *)this,0);
    pBVar1 = (this->super_BufferCase).m_verifier;
    (*pBVar1->_vptr_BufferParamVerifier[2])
              (pBVar1,(this->super_BufferCase).super_ApiCase.super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx,(ulong)(this->super_BufferCase).m_bufferTarget,0x8765
               ,(ulong)usage);
    ApiCase::expectError((ApiCase *)this,0);
  }
  return;
}

Assistant:

void testBuffer (void)
	{
		const GLenum usages[] =
		{
			GL_STATIC_DRAW, GL_DYNAMIC_DRAW, GL_STREAM_DRAW
		};

		m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_USAGE, GL_STATIC_DRAW);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(usages); ++ndx)
		{
			glBufferData(m_bufferTarget, 16, DE_NULL, usages[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_bufferTarget, GL_BUFFER_USAGE, usages[ndx]);
			expectError(GL_NO_ERROR);
		}
	}